

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

bool vkt::shaderexecutor::
     ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doContains
               (IVal *ival,Matrix<float,_3,_3> *value)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 3) break;
    bVar2 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                      ((IVal *)ival,(Vector<float,_3> *)value);
    value = (Matrix<float,_3,_3> *)((long)value + 0xc);
    ival = (IVal *)((long)ival + 0x48);
    uVar1 = uVar3 + 1;
  } while (bVar2);
  return 2 < uVar3;
}

Assistant:

static bool			doContains		(const IVal& ival, const T& value)
	{
		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			if (!contains(ival[ndx], value[ndx]))
				return false;

		return true;
	}